

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_clearcache(global_State *g)

{
  int local_18;
  int local_14;
  int j;
  int i;
  global_State *g_local;
  
  for (local_14 = 0; local_14 < 0x35; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      if ((g->strcache[local_14][local_18]->marked & 0x18) != 0) {
        g->strcache[local_14][local_18] = g->memerrmsg;
      }
    }
  }
  return;
}

Assistant:

void luaS_clearcache (global_State *g) {
  int i, j;
  for (i = 0; i < STRCACHE_N; i++)
    for (j = 0; j < STRCACHE_M; j++) {
      if (iswhite(g->strcache[i][j]))  /* will entry be collected? */
        g->strcache[i][j] = g->memerrmsg;  /* replace it with something fixed */
    }
}